

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_getmetatable(jit_State *J,RecordFFData *rd)

{
  int iVar1;
  undefined8 *in_RSI;
  long in_RDI;
  RecordIndex ix;
  jit_State *in_stack_00000048;
  TRef tr;
  undefined8 local_78 [6];
  int local_48;
  undefined4 local_3c;
  undefined4 local_38;
  int local_2c;
  long local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 local_8;
  
  local_10 = (undefined1 *)local_78;
  local_48 = **(int **)(in_RDI + 0x80);
  if (local_48 != 0) {
    local_8 = *(undefined8 *)(in_RDI + 0x60);
    local_18 = (undefined8 *)*in_RSI;
    local_78[0] = *local_18;
    local_2c = local_48;
    local_20 = in_RDI;
    iVar1 = lj_record_mm_lookup(in_stack_00000048,(RecordIndex *)ix._64_8_,ix.mt);
    if (iVar1 == 0) {
      **(undefined4 **)(local_20 + 0x80) = local_3c;
    }
    else {
      **(undefined4 **)(local_20 + 0x80) = local_38;
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_getmetatable(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tr) {
    RecordIndex ix;
    ix.tab = tr;
    copyTV(J->L, &ix.tabv, &rd->argv[0]);
    if (lj_record_mm_lookup(J, &ix, MM_metatable))
      J->base[0] = ix.mobj;
    else
      J->base[0] = ix.mt;
  }  /* else: Interpreter will throw. */
}